

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall cmListFileParser::IssueError(cmListFileParser *this,string *text)

{
  cmListFileContext local_128;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_b8;
  undefined1 local_a8 [8];
  cmListFileBacktrace lfbt;
  undefined1 local_88 [8];
  cmListFileContext lfc;
  string *text_local;
  cmListFileParser *this_local;
  
  lfc.DeferId.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = text;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_88);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),this->FileName);
  lfc.FilePath.field_2._8_8_ = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_a8,&this->Backtrace);
  cmListFileContext::cmListFileContext(&local_128,(cmListFileContext *)local_88);
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            (&local_b8,(cmListFileContext *)local_a8);
  cmListFileBacktrace::operator=((cmListFileBacktrace *)local_a8,(cmListFileBacktrace *)&local_b8);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_b8);
  cmListFileContext::~cmListFileContext(&local_128);
  cmMessenger::IssueMessage
            (this->Messenger,FATAL_ERROR,
             (string *)
             lfc.DeferId.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._32_8_,(cmListFileBacktrace *)local_a8);
  cmSystemTools::SetFatalErrorOccurred();
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_a8);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_88);
  return;
}

Assistant:

void cmListFileParser::IssueError(const std::string& text) const
{
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = cmListFileLexer_GetCurrentLine(this->Lexer);
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, text, lfbt);
  cmSystemTools::SetFatalErrorOccurred();
}